

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void processIncludeDirectories
               (cmGeneratorTarget *tgt,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *includes,
               hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *uniqueIncludes,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugIncludes,string *language)

{
  cmLinkImplItem *pcVar1;
  MessageType MVar2;
  bool bVar3;
  PolicyStatus PVar4;
  reference ppTVar5;
  cmCompiledGeneratorExpression *pcVar6;
  cmLocalGenerator *pcVar7;
  char *pcVar8;
  ostream *poVar9;
  reference pbVar10;
  ulong uVar11;
  cmake *this;
  string *psVar12;
  PolicyID id;
  PolicyID id_00;
  bool local_5a9;
  cmListFileBacktrace local_5a8;
  allocator local_561;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_4a0;
  undefined1 local_488 [8];
  string inc;
  string local_448;
  MessageType local_428;
  byte local_421;
  MessageType messageType_1;
  bool noMessage;
  ostringstream e_1;
  string local_2a0;
  string local_280;
  MessageType local_25c;
  undefined1 local_258 [4];
  MessageType messageType;
  ostringstream e;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  iterator li;
  string usedIncludes;
  string local_a0;
  undefined1 local_80 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryIncludes;
  bool checkCMP0027;
  bool fromImported;
  string *targetName;
  cmLinkImplItem *item;
  const_iterator end;
  const_iterator it;
  bool debugIncludes_local;
  string *config_local;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *uniqueIncludes_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *includes_local;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *entries_local;
  cmGeneratorTarget *tgt_local;
  
  end = std::
        vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
        ::begin(entries);
  item = (cmLinkImplItem *)
         std::
         vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
         ::end(entries);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
                             *)&item);
    if (!bVar3) {
      return;
    }
    ppTVar5 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
              ::operator*(&end);
    pcVar1 = (*ppTVar5)->LinkImplItem;
    local_5a9 = false;
    if ((pcVar1->super_cmLinkItem).Target != (cmGeneratorTarget *)0x0) {
      local_5a9 = cmGeneratorTarget::IsImported((pcVar1->super_cmLinkItem).Target);
    }
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_5a9;
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = pcVar1->FromGenex & 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_80);
    ppTVar5 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
              ::operator*(&end);
    pcVar6 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&(*ppTVar5)->ge);
    pcVar7 = cmGeneratorTarget::GetLocalGenerator(tgt);
    pcVar8 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar6,pcVar7,config,false,tgt,dagChecker,language);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a0,pcVar8,(allocator *)(usedIncludes.field_2._M_local_buf + 0xb));
    cmSystemTools::ExpandListArgument
              (&local_a0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_80,false);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)(usedIncludes.field_2._M_local_buf + 0xb));
    std::__cxx11::string::string((string *)&li);
    local_d8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_80);
    while( true ) {
      local_e0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_80);
      bVar3 = __gnu_cxx::operator!=(&local_d8,&local_e0);
      if (!bVar3) break;
      if ((entryIncludes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_d8);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        bVar3 = cmsys::SystemTools::FileExists(pcVar8);
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
          local_25c = FATAL_ERROR;
          if ((entryIncludes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
            PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0027(tgt);
            if (PVar4 != OLD) {
              if (PVar4 != WARN) goto LAB_006a8d79;
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_280,(cmPolicies *)0x1b,id);
              poVar9 = std::operator<<((ostream *)local_258,(string *)&local_280);
              std::operator<<(poVar9,"\n");
              std::__cxx11::string::~string((string *)&local_280);
            }
            local_25c = AUTHOR_WARNING;
          }
LAB_006a8d79:
          poVar9 = std::operator<<((ostream *)local_258,"Imported target \"");
          poVar9 = std::operator<<(poVar9,(string *)pcVar1);
          poVar9 = std::operator<<(poVar9,"\" includes non-existent path\n  \"");
          pbVar10 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_d8);
          poVar9 = std::operator<<(poVar9,(string *)pbVar10);
          std::operator<<(poVar9,
                          "\"\nin its INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n* The path was deleted, renamed, or moved to another location.\n* An install or uninstall procedure did not complete successfully.\n* The installation package was faulty and references files it does not provide.\n"
                         );
          pcVar7 = cmGeneratorTarget::GetLocalGenerator(tgt);
          MVar2 = local_25c;
          std::__cxx11::ostringstream::str();
          cmLocalGenerator::IssueMessage(pcVar7,MVar2,&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          bVar3 = true;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
          goto LAB_006a95a7;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_d8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      bVar3 = cmsys::SystemTools::FileIsFullPath(pcVar8);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&messageType_1);
        local_421 = 0;
        local_428 = FATAL_ERROR;
        uVar11 = std::__cxx11::string::empty();
        if ((uVar11 & 1) == 0) {
          poVar9 = std::operator<<((ostream *)&messageType_1,"Target \"");
          poVar9 = std::operator<<(poVar9,(string *)pcVar1);
          poVar9 = std::operator<<(poVar9,
                                   "\" contains relative path in its INTERFACE_INCLUDE_DIRECTORIES:\n  \""
                                  );
          pbVar10 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_d8);
          poVar9 = std::operator<<(poVar9,(string *)pbVar10);
          std::operator<<(poVar9,"\"");
        }
        else {
          PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0021(tgt);
          if (PVar4 == OLD) {
            local_421 = 1;
          }
          else if (PVar4 == WARN) {
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_448,(cmPolicies *)0x15,id_00);
            poVar9 = std::operator<<((ostream *)&messageType_1,(string *)&local_448);
            std::operator<<(poVar9,"\n");
            std::__cxx11::string::~string((string *)&local_448);
            local_428 = AUTHOR_WARNING;
          }
          poVar9 = std::operator<<((ostream *)&messageType_1,
                                   "Found relative path while evaluating include directories of \"")
          ;
          psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
          poVar9 = std::operator<<(poVar9,(string *)psVar12);
          poVar9 = std::operator<<(poVar9,"\":\n  \"");
          pbVar10 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_d8);
          poVar9 = std::operator<<(poVar9,(string *)pbVar10);
          std::operator<<(poVar9,"\"\n");
        }
        if ((local_421 & 1) == 0) {
          pcVar7 = cmGeneratorTarget::GetLocalGenerator(tgt);
          MVar2 = local_428;
          std::__cxx11::ostringstream::str();
          cmLocalGenerator::IssueMessage(pcVar7,MVar2,(string *)((long)&inc.field_2 + 8));
          std::__cxx11::string::~string((string *)(inc.field_2._M_local_buf + 8));
          if (local_428 != FATAL_ERROR) goto LAB_006a91b9;
          bVar3 = true;
        }
        else {
LAB_006a91b9:
          bVar3 = false;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&messageType_1);
        if (bVar3) goto LAB_006a95a7;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_d8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      bVar3 = cmSystemTools::IsOff(pcVar8);
      if (!bVar3) {
        pbVar10 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_d8);
        cmsys::SystemTools::ConvertToUnixSlashes(pbVar10);
      }
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_d8);
      std::__cxx11::string::string((string *)local_488,(string *)pbVar10);
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert(&local_4a0,uniqueIncludes,(value_type *)local_488);
      if (((local_4a0.second & 1U) != 0) &&
         (std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(includes,(value_type *)local_488), debugIncludes)) {
        std::operator+(&local_4e0," * ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_488);
        std::operator+(&local_4c0,&local_4e0,"\n");
        std::__cxx11::string::operator+=((string *)&li,(string *)&local_4c0);
        std::__cxx11::string::~string((string *)&local_4c0);
        std::__cxx11::string::~string((string *)&local_4e0);
      }
      std::__cxx11::string::~string((string *)local_488);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_d8);
    }
    uVar11 = std::__cxx11::string::empty();
    if ((uVar11 & 1) == 0) {
      pcVar7 = cmGeneratorTarget::GetLocalGenerator(tgt);
      this = cmLocalGenerator::GetCMakeInstance(pcVar7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_560,"Used includes for target ",&local_561);
      psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
      std::operator+(&local_540,&local_560,psVar12);
      std::operator+(&local_520,&local_540,":\n");
      std::operator+(&local_500,&local_520,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&li);
      ppTVar5 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
                ::operator*(&end);
      pcVar6 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&(*ppTVar5)->ge);
      cmCompiledGeneratorExpression::GetBacktrace(&local_5a8,pcVar6);
      cmake::IssueMessage(this,LOG,&local_500,&local_5a8,false);
      cmListFileBacktrace::~cmListFileBacktrace(&local_5a8);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_520);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_560);
      std::allocator<char>::~allocator((allocator<char> *)&local_561);
    }
    bVar3 = false;
LAB_006a95a7:
    std::__cxx11::string::~string((string *)&li);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80);
    if (bVar3) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
    ::operator++(&end);
  } while( true );
}

Assistant:

static void processIncludeDirectories(cmGeneratorTarget const* tgt,
      const std::vector<cmGeneratorTarget::TargetPropertyEntry*> &entries,
      std::vector<std::string> &includes,
      UNORDERED_SET<std::string> &uniqueIncludes,
      cmGeneratorExpressionDAGChecker *dagChecker,
      const std::string& config, bool debugIncludes,
      const std::string& language)
{
  for (std::vector<cmGeneratorTarget::TargetPropertyEntry*>::const_iterator
      it = entries.begin(), end = entries.end(); it != end; ++it)
    {
    cmLinkImplItem const& item = (*it)->LinkImplItem;
    std::string const& targetName = item;
    bool const fromImported = item.Target && item.Target->IsImported();
    bool const checkCMP0027 = item.FromGenex;
    std::vector<std::string> entryIncludes;
    cmSystemTools::ExpandListArgument((*it)->ge->Evaluate(
                                        tgt->GetLocalGenerator(),
                                              config,
                                              false,
                                              tgt,
                                              dagChecker, language),
                                    entryIncludes);

    std::string usedIncludes;
    for(std::vector<std::string>::iterator
          li = entryIncludes.begin(); li != entryIncludes.end(); ++li)
      {
      if (fromImported
          && !cmSystemTools::FileExists(li->c_str()))
        {
        std::ostringstream e;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        if (checkCMP0027)
          {
          switch(tgt->GetPolicyStatusCMP0027())
            {
            case cmPolicies::WARN:
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0027) << "\n";
            case cmPolicies::OLD:
              messageType = cmake::AUTHOR_WARNING;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
            }
          }
        e << "Imported target \"" << targetName << "\" includes "
             "non-existent path\n  \"" << *li << "\"\nin its "
             "INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n"
             "* The path was deleted, renamed, or moved to another "
             "location.\n"
             "* An install or uninstall procedure did not complete "
             "successfully.\n"
             "* The installation package was faulty and references files it "
             "does not provide.\n";
        tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
        return;
        }

      if (!cmSystemTools::FileIsFullPath(li->c_str()))
        {
        std::ostringstream e;
        bool noMessage = false;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        if (!targetName.empty())
          {
          e << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_INCLUDE_DIRECTORIES:\n"
            "  \"" << *li << "\"";
          }
        else
          {
          switch(tgt->GetPolicyStatusCMP0021())
            {
            case cmPolicies::WARN:
              {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0021) << "\n";
              messageType = cmake::AUTHOR_WARNING;
              }
              break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
            }
          e << "Found relative path while evaluating include directories of "
          "\"" << tgt->GetName() << "\":\n  \"" << *li << "\"\n";
          }
        if (!noMessage)
          {
          tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
          if (messageType == cmake::FATAL_ERROR)
            {
            return;
            }
          }
        }

      if (!cmSystemTools::IsOff(li->c_str()))
        {
        cmSystemTools::ConvertToUnixSlashes(*li);
        }
      std::string inc = *li;

      if(uniqueIncludes.insert(inc).second)
        {
        includes.push_back(inc);
        if (debugIncludes)
          {
          usedIncludes += " * " + inc + "\n";
          }
        }
      }
    if (!usedIncludes.empty())
      {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(cmake::LOG,
                            std::string("Used includes for target ")
                            + tgt->GetName() + ":\n"
                            + usedIncludes, (*it)->ge->GetBacktrace());
      }
    }
}